

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  bool bVar1;
  uint uVar2;
  char *message;
  int numParticles;
  ParticleArray particles;
  AssertionResult gtest_ar;
  Message local_90;
  AssertHelper local_88;
  int local_7c;
  void *local_78;
  iterator iStack_70;
  Particle<(pica::Dimension)1> *local_68;
  Particle local_58;
  
  local_78 = (void *)0x0;
  iStack_70._M_current = (Particle<(pica::Dimension)1> *)0x0;
  local_68 = (Particle<(pica::Dimension)1> *)0x0;
  local_7c = 0xc;
  uVar2 = 0xffffffff;
  do {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              (&local_58,(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this,
               (PositionType)0xc024000000000000,(PositionType)0x4024000000000000);
    if (iStack_70._M_current == local_68) {
      std::
      vector<pica::Particle<(pica::Dimension)1>,std::allocator<pica::Particle<(pica::Dimension)1>>>
      ::_M_realloc_insert<pica::Particle<(pica::Dimension)1>const&>
                ((vector<pica::Particle<(pica::Dimension)1>,std::allocator<pica::Particle<(pica::Dimension)1>>>
                  *)&local_78,iStack_70,&local_58);
    }
    else {
      (iStack_70._M_current)->typeIndex = local_58.typeIndex;
      *(undefined6 *)&(iStack_70._M_current)->field_0x32 = local_58._50_6_;
      (iStack_70._M_current)->factor = local_58.factor;
      (iStack_70._M_current)->invGamma = local_58.invGamma;
      ((iStack_70._M_current)->p).y = local_58.p.y;
      ((iStack_70._M_current)->p).z = local_58.p.z;
      ((iStack_70._M_current)->position).x =
           (double)CONCAT71(local_58.position.x._1_7_,local_58.position.x._0_1_);
      ((iStack_70._M_current)->p).x = local_58.p.x;
      iStack_70._M_current = iStack_70._M_current + 1;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 < 0xb);
  local_90.ss_.ptr_._0_4_ =
       (int)((ulong)((long)iStack_70._M_current - (long)local_78) >> 3) * -0x49249249;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_58,"numParticles","particles.size()",&local_7c,(int *)&local_90);
  if (local_58.position.x._0_1_ == '\0') {
    testing::Message::Message(&local_90);
    if ((undefined8 *)local_58.p.x == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_58.p.x;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x45,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT44(local_90.ss_.ptr_._4_4_,(int)local_90.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_90.ss_.ptr_._4_4_,(int)local_90.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_90.ss_.ptr_._4_4_,(int)local_90.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.p,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}